

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_boolean_with_map(void)

{
  basic_variable<std::allocator<char>_> *local_180;
  basic_variable<std::allocator<char>_> *local_168;
  undefined1 local_154;
  undefined1 local_153 [2];
  undefined1 local_151;
  basic_variable<std::allocator<char>_> *local_150;
  basic_variable<std::allocator<char>_> local_148;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 auStack_e8 [32];
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb53,"void assign_suite::assign_boolean_with_map()",local_3a,&local_3b);
  local_151 = 1;
  auStack_e8._24_8_ = &local_c8;
  local_150 = &local_148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_150,"alpha");
  local_150 = &local_118;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_150,"hydrogen");
  auStack_e8._8_8_ = &local_148;
  auStack_e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_e8 + 8));
  local_151 = 0;
  local_98._0_8_ = &local_c8;
  local_98._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_168 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_168 = local_168 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_168);
  } while (local_168 != &local_c8);
  local_180 = (basic_variable<std::allocator<char>_> *)auStack_e8;
  do {
    local_180 = local_180 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_180);
  } while (local_180 != &local_148);
  local_153[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_154 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb55,"void assign_suite::assign_boolean_with_map()",local_153,&local_154);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void assign_boolean_with_map()
{
    variable data(true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
    data = {{ "alpha", "hydrogen" }};
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
}